

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
Lib::Array<Parse::TPTP::Token>::expandToFit(Array<Parse::TPTP::Token> *this,size_t n)

{
  uint uVar1;
  void *placement;
  Token *pTVar2;
  size_t length;
  ulong uVar3;
  size_t length_00;
  
  uVar3 = this->_capacity * 2;
  length_00 = n + 1;
  if (n < uVar3) {
    length_00 = uVar3;
  }
  placement = Lib::alloc(length_00 * 0x28);
  pTVar2 = array_new<Parse::TPTP::Token>(placement,length_00);
  if (this->_capacity == 0) {
    length = 0;
  }
  else {
    uVar3 = this->_capacity & 0xffffffff;
    while( true ) {
      uVar3 = uVar3 - 1;
      if ((int)(uint)uVar3 < 0) break;
      uVar1 = (uint)uVar3 & 0x7fffffff;
      Parse::TPTP::Token::operator=(pTVar2 + uVar1,this->_array + uVar1);
    }
    length = this->_capacity;
  }
  if (this->_array != (Token *)0x0) {
    array_delete<Parse::TPTP::Token>(this->_array,length);
    Lib::free(this->_array);
    length = this->_capacity;
  }
  this->_array = pTVar2;
  (**this->_vptr_Array)(this,length,length_00);
  this->_capacity = length_00;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }